

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void __thiscall
duckdb::UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan>::Insert
          (UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan> *this,ArenaAllocator *allocator
          ,string_t *value)

{
  ulong uVar1;
  bool bVar2;
  HeapEntry<duckdb::string_t> *this_00;
  
  uVar1 = this->size;
  if (uVar1 < this->capacity) {
    this->size = uVar1 + 1;
    this_00 = this->heap + uVar1;
  }
  else {
    bVar2 = string_t::StringComparisonOperators::GreaterThan(value,&this->heap->value);
    if (!bVar2) {
      return;
    }
    ::std::
    pop_heap<duckdb::HeapEntry<duckdb::string_t>*,bool(*)(duckdb::HeapEntry<duckdb::string_t>const&,duckdb::HeapEntry<duckdb::string_t>const&)>
              (this->heap,this->heap + this->size,Compare);
    this_00 = this->heap + (this->size - 1);
  }
  HeapEntry<duckdb::string_t>::Assign(this_00,allocator,value);
  ::std::
  push_heap<duckdb::HeapEntry<duckdb::string_t>*,bool(*)(duckdb::HeapEntry<duckdb::string_t>const&,duckdb::HeapEntry<duckdb::string_t>const&)>
            (this->heap,this->heap + this->size,Compare);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const T &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size++].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (T_COMPARATOR::Operation(value, heap[0].value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}